

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O1

char * varinfo(lua_State *L,TValue *o)

{
  CallInfo *pCVar1;
  long lVar2;
  bool bVar3;
  char *pcVar4;
  int reg;
  StkId pSVar5;
  int iVar6;
  long lVar7;
  char *name;
  char *local_10;
  
  pCVar1 = L->ci;
  local_10 = (char *)0x0;
  if ((pCVar1->callstatus & 2) == 0) {
    lVar2 = *(long *)(pCVar1->func).p;
    bVar3 = true;
    if (*(byte *)(lVar2 + 10) == 0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar4 = (char *)0x0;
      lVar7 = 0;
      do {
        if (*(TValue **)(*(long *)(lVar2 + 0x20 + lVar7) + 0x10) == o) {
          lVar7 = *(long *)(*(long *)(*(long *)(lVar2 + 0x18) + 0x50) + lVar7 * 2);
          local_10 = "?";
          if (lVar7 != 0) {
            local_10 = (char *)(lVar7 + 0x18);
          }
          pcVar4 = "upvalue";
          bVar3 = false;
          break;
        }
        lVar7 = lVar7 + 8;
      } while ((ulong)*(byte *)(lVar2 + 10) * 8 != lVar7);
    }
    if (!bVar3) goto LAB_00110c23;
    pSVar5 = (pCVar1->func).p + 1;
    reg = -1;
    if (pSVar5 < (pCVar1->top).p) {
      iVar6 = 0;
      do {
        reg = iVar6;
        if (pSVar5 == (StkId)o) break;
        iVar6 = iVar6 + 1;
        pSVar5 = pSVar5 + 1;
        reg = -1;
      } while (pSVar5 < (pCVar1->top).p);
    }
    if (-1 < reg) {
      pcVar4 = getobjname(*(Proto **)(lVar2 + 0x18),
                          (int)((ulong)((long)(pCVar1->u).l.savedpc -
                                       (long)(*(Proto **)(lVar2 + 0x18))->code) >> 2) + -1,reg,
                          &local_10);
      goto LAB_00110c23;
    }
  }
  pcVar4 = (char *)0x0;
LAB_00110c23:
  if (pcVar4 == (char *)0x0) {
    return "";
  }
  pcVar4 = luaO_pushfstring(L," (%s \'%s\')",pcVar4,local_10);
  return pcVar4;
}

Assistant:

static const char *varinfo (lua_State *L, const TValue *o) {
  CallInfo *ci = L->ci;
  const char *name = NULL;  /* to avoid warnings */
  const char *kind = NULL;
  if (isLua(ci)) {
    kind = getupvalname(ci, o, &name);  /* check whether 'o' is an upvalue */
    if (!kind) {  /* not an upvalue? */
      int reg = instack(ci, o);  /* try a register */
      if (reg >= 0)  /* is 'o' a register? */
        kind = getobjname(ci_func(ci)->p, currentpc(ci), reg, &name);
    }
  }
  return formatvarinfo(L, kind, name);
}